

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O1

void glslang::SpirvToolsValidate
               (TIntermediate *intermediate,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,SpvBuildLogger *logger,
               bool prelegalization)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  spv_target_env env;
  spv_context context;
  spv_validator_options options;
  spv_diagnostic diagnostic;
  spv_const_binary_t binary;
  allocator<char> local_69;
  spv_diagnostic local_68;
  value_type local_60;
  spv_const_binary_t local_40;
  
  env = MapToSpirvToolsEnv(&intermediate->spvVersion,logger);
  context = spvContextCreate(env);
  local_40.code =
       (spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_40.wordCount =
       (long)(spirv->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)local_40.code >> 2;
  local_68 = (spv_diagnostic)0x0;
  options = spvValidatorOptionsCreate();
  spvValidatorOptionsSetRelaxBlockLayout(options,intermediate->hlslOffsets);
  spvValidatorOptionsSetBeforeHlslLegalization(options,prelegalization);
  bVar2 = TIntermediate::IsRequestedExtension(intermediate,"GL_EXT_scalar_block_layout");
  spvValidatorOptionsSetScalarBlockLayout(options,bVar2);
  bVar2 = TIntermediate::IsRequestedExtension(intermediate,"GL_EXT_scalar_block_layout");
  spvValidatorOptionsSetWorkgroupScalarBlockLayout(options,bVar2);
  bVar2 = TIntermediate::IsRequestedExtension(intermediate,"GL_EXT_texture_offset_non_const");
  spvValidatorOptionsSetAllowOffsetTextureOperand(options,bVar2);
  spvValidateWithOptions(context,options,&local_40,&local_68);
  if (local_68 != (spv_diagnostic)0x0) {
    paVar1 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"SPIRV-Tools Validation Errors","");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&logger->errors,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,local_68->error,&local_69);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&logger->errors,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  spvValidatorOptionsDestroy(options);
  spvDiagnosticDestroy(local_68);
  spvContextDestroy(context);
  return;
}

Assistant:

void SpirvToolsValidate(const glslang::TIntermediate& intermediate, std::vector<unsigned int>& spirv,
                        spv::SpvBuildLogger* logger, bool prelegalization)
{
    // validate
    spv_context context = spvContextCreate(MapToSpirvToolsEnv(intermediate.getSpv(), logger));
    spv_const_binary_t binary = { spirv.data(), spirv.size() };
    spv_diagnostic diagnostic = nullptr;
    spv_validator_options options = spvValidatorOptionsCreate();
    spvValidatorOptionsSetRelaxBlockLayout(options, intermediate.usingHlslOffsets());
    spvValidatorOptionsSetBeforeHlslLegalization(options, prelegalization);
    spvValidatorOptionsSetScalarBlockLayout(options, intermediate.usingScalarBlockLayout());
    spvValidatorOptionsSetWorkgroupScalarBlockLayout(options, intermediate.usingScalarBlockLayout());
    spvValidatorOptionsSetAllowOffsetTextureOperand(options, intermediate.usingTextureOffsetNonConst());
    spvValidateWithOptions(context, options, &binary, &diagnostic);

    // report
    if (diagnostic != nullptr) {
        logger->error("SPIRV-Tools Validation Errors");
        logger->error(diagnostic->error);
    }

    // tear down
    spvValidatorOptionsDestroy(options);
    spvDiagnosticDestroy(diagnostic);
    spvContextDestroy(context);
}